

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  Vector3f *d;
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  SampledWavelengths *in_RSI;
  ImageInfiniteLight *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  Vector3<float> VVar12;
  Point2f st;
  Vector3f wl;
  Vector3<float> *in_stack_00000088;
  Transform *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffff0;
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  
  auVar10 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  VVar12 = Transform::ApplyInverse<float>(in_stack_00000090,in_stack_00000088);
  auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar8;
  vmovlpd_avx(auVar4._0_16_);
  VVar12 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  auVar5._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar8;
  d = (Vector3f *)vmovlpd_avx(auVar5._0_16_);
  auVar6._0_8_ = EqualAreaSphereToSquare(d);
  auVar6._8_56_ = extraout_var;
  vmovlpd_avx(auVar6._0_16_);
  auVar8 = ZEXT856(0);
  SVar11 = LookupLe(in_RDI,(Point2f)in_stack_fffffffffffffff0,in_RSI);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar7._0_8_ = SVar11.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  uVar2 = vmovlpd_avx(auVar9._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f st = EqualAreaSphereToSquare(wl);
        return LookupLe(st, lambda);
    }